

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  long lVar11;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar12;
  undefined4 uVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  UVIdentity<4> *pUVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  float fVar112;
  float fVar114;
  undefined1 auVar113 [16];
  float fVar115;
  float fVar118;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar119;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [16];
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  undefined1 local_1218 [16];
  undefined1 (*local_1200) [16];
  ulong local_11f8;
  StackItemT<embree::NodeRefPtr<4>_> *local_11f0;
  long local_11e8;
  long local_11e0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1198;
  undefined8 uStack_1190;
  vfloat<4> tNear;
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1038;
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_11f0 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1058._4_4_ = uVar13;
  local_1058._0_4_ = uVar13;
  local_1058._8_4_ = uVar13;
  local_1058._12_4_ = uVar13;
  auVar93 = ZEXT1664(local_1058);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1068._4_4_ = uVar13;
  local_1068._0_4_ = uVar13;
  local_1068._8_4_ = uVar13;
  local_1068._12_4_ = uVar13;
  auVar94 = ZEXT1664(local_1068);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1078._4_4_ = uVar13;
  local_1078._0_4_ = uVar13;
  local_1078._8_4_ = uVar13;
  local_1078._12_4_ = uVar13;
  auVar101 = ZEXT1664(local_1078);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar119 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar125 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar102 = fVar115 * 0.99999964;
  fVar107 = fVar119 * 0.99999964;
  fVar112 = fVar125 * 0.99999964;
  fVar115 = fVar115 * 1.0000004;
  fVar119 = fVar119 * 1.0000004;
  fVar125 = fVar125 * 1.0000004;
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar32 = uVar30 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar78._4_4_ = iVar2;
  auVar78._0_4_ = iVar2;
  auVar78._8_4_ = iVar2;
  auVar78._12_4_ = iVar2;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar42 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_1200 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_1088 = fVar102;
  fStack_1084 = fVar102;
  fStack_1080 = fVar102;
  fStack_107c = fVar102;
  local_1098 = fVar107;
  fStack_1094 = fVar107;
  fStack_1090 = fVar107;
  fStack_108c = fVar107;
  local_10a8 = fVar112;
  fStack_10a4 = fVar112;
  fStack_10a0 = fVar112;
  fStack_109c = fVar112;
  local_10b8 = fVar115;
  fStack_10b4 = fVar115;
  fStack_10b0 = fVar115;
  fStack_10ac = fVar115;
  local_10c8 = fVar119;
  fStack_10c4 = fVar119;
  fStack_10c0 = fVar119;
  fStack_10bc = fVar119;
  local_10d8 = fVar125;
  fStack_10d4 = fVar125;
  fStack_10d0 = fVar125;
  fStack_10cc = fVar125;
  fVar104 = fVar102;
  fVar105 = fVar102;
  fVar106 = fVar102;
  fVar109 = fVar107;
  fVar110 = fVar107;
  fVar111 = fVar107;
  fVar114 = fVar112;
  fVar126 = fVar112;
  fVar129 = fVar112;
  fVar131 = fVar115;
  fVar133 = fVar115;
  fVar118 = fVar115;
  fVar122 = fVar119;
  fVar123 = fVar119;
  fVar124 = fVar119;
  fVar128 = fVar125;
  fVar130 = fVar125;
  fVar132 = fVar125;
  local_11f8 = uVar30;
LAB_0157a4fb:
  do {
    do {
      if (local_11f0 == stack) {
        return;
      }
      pSVar12 = local_11f0 + -1;
      local_11f0 = local_11f0 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar12->dist);
    uVar19 = (local_11f0->ptr).ptr;
    while ((uVar19 & 8) == 0) {
      uVar14 = uVar19 & 0xfffffffffffffff0;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar43._4_4_ = uVar13;
      auVar43._0_4_ = uVar13;
      auVar43._8_4_ = uVar13;
      auVar43._12_4_ = uVar13;
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar21),auVar43,
                                *(undefined1 (*) [16])(uVar14 + 0x20 + uVar21));
      auVar44 = vsubps_avx(auVar44,auVar93._0_16_);
      auVar52._0_4_ = fVar102 * auVar44._0_4_;
      auVar52._4_4_ = fVar104 * auVar44._4_4_;
      auVar52._8_4_ = fVar105 * auVar44._8_4_;
      auVar52._12_4_ = fVar106 * auVar44._12_4_;
      auVar44 = vmaxps_avx(auVar78,auVar52);
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar30),auVar43,
                                *(undefined1 (*) [16])(uVar14 + 0x20 + uVar30));
      auVar52 = vsubps_avx(auVar52,auVar94._0_16_);
      auVar57._0_4_ = fVar107 * auVar52._0_4_;
      auVar57._4_4_ = fVar109 * auVar52._4_4_;
      auVar57._8_4_ = fVar110 * auVar52._8_4_;
      auVar57._12_4_ = fVar111 * auVar52._12_4_;
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar29),auVar43,
                                *(undefined1 (*) [16])(uVar14 + 0x20 + uVar29));
      auVar52 = vsubps_avx(auVar52,auVar101._0_16_);
      auVar63._0_4_ = fVar112 * auVar52._0_4_;
      auVar63._4_4_ = fVar114 * auVar52._4_4_;
      auVar63._8_4_ = fVar126 * auVar52._8_4_;
      auVar63._12_4_ = fVar129 * auVar52._12_4_;
      auVar52 = vmaxps_avx(auVar57,auVar63);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar44,auVar52);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar21 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar14 + 0x20 + (uVar21 ^ 0x10)));
      auVar44 = vsubps_avx(auVar44,auVar93._0_16_);
      auVar58._0_4_ = fVar115 * auVar44._0_4_;
      auVar58._4_4_ = fVar131 * auVar44._4_4_;
      auVar58._8_4_ = fVar133 * auVar44._8_4_;
      auVar58._12_4_ = fVar118 * auVar44._12_4_;
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + uVar32),auVar43,
                                *(undefined1 (*) [16])(uVar14 + 0x20 + uVar32));
      auVar44 = vminps_avx(auVar42._0_16_,auVar58);
      auVar52 = vsubps_avx(auVar52,auVar94._0_16_);
      auVar64._0_4_ = fVar119 * auVar52._0_4_;
      auVar64._4_4_ = fVar122 * auVar52._4_4_;
      auVar64._8_4_ = fVar123 * auVar52._8_4_;
      auVar64._12_4_ = fVar124 * auVar52._12_4_;
      auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar14 + 0x80 + (uVar29 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar14 + 0x20 + (uVar29 ^ 0x10)));
      auVar52 = vsubps_avx(auVar52,auVar101._0_16_);
      auVar72._0_4_ = fVar125 * auVar52._0_4_;
      auVar72._4_4_ = fVar128 * auVar52._4_4_;
      auVar72._8_4_ = fVar130 * auVar52._8_4_;
      auVar72._12_4_ = fVar132 * auVar52._12_4_;
      auVar52 = vminps_avx(auVar64,auVar72);
      auVar44 = vminps_avx(auVar44,auVar52);
      if (((uint)uVar19 & 7) == 6) {
        auVar52 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar44,2);
        auVar44 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar43,2);
        auVar43 = vcmpps_avx(auVar43,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
        auVar44 = vandps_avx(auVar44,auVar43);
        auVar44 = vandps_avx(auVar44,auVar52);
      }
      else {
        auVar44 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar44,2);
      }
      auVar44 = vpslld_avx(auVar44,0x1f);
      uVar16 = vmovmskps_avx(auVar44);
      if (uVar16 == 0) goto LAB_0157a4fb;
      uVar16 = uVar16 & 0xff;
      lVar11 = 0;
      for (uVar19 = (ulong)uVar16; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar19 = *(ulong *)(uVar14 + lVar11 * 8);
      uVar16 = uVar16 - 1 & uVar16;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        uVar4 = tNear.field_0.i[lVar11];
        lVar11 = 0;
        for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar16 = uVar16 - 1 & uVar16;
        uVar20 = (ulong)uVar16;
        uVar17 = *(ulong *)(uVar14 + lVar11 * 8);
        uVar5 = tNear.field_0.i[lVar11];
        if (uVar16 == 0) {
          if (uVar4 < uVar5) {
            (local_11f0->ptr).ptr = uVar17;
            local_11f0->dist = uVar5;
            local_11f0 = local_11f0 + 1;
          }
          else {
            (local_11f0->ptr).ptr = uVar19;
            local_11f0->dist = uVar4;
            uVar19 = uVar17;
            local_11f0 = local_11f0 + 1;
          }
        }
        else {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar19;
          auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar4));
          auVar53._8_8_ = 0;
          auVar53._0_8_ = uVar17;
          auVar52 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar5));
          lVar11 = 0;
          for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar16 = uVar16 - 1 & uVar16;
          uVar19 = (ulong)uVar16;
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(uVar14 + lVar11 * 8);
          auVar57 = vpunpcklqdq_avx(auVar59,ZEXT416((uint)tNear.field_0.i[lVar11]));
          auVar43 = vpcmpgtd_avx(auVar52,auVar44);
          if (uVar16 == 0) {
            auVar58 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar52,auVar44,auVar58);
            auVar44 = vblendvps_avx(auVar44,auVar52,auVar58);
            auVar52 = vpcmpgtd_avx(auVar57,auVar43);
            auVar58 = vpshufd_avx(auVar52,0xaa);
            auVar52 = vblendvps_avx(auVar57,auVar43,auVar58);
            auVar43 = vblendvps_avx(auVar43,auVar57,auVar58);
            auVar57 = vpcmpgtd_avx(auVar43,auVar44);
            auVar57 = vpshufd_avx(auVar57,0xaa);
            SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar43,auVar44,auVar57);
            SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar44,auVar43,auVar57);
            *local_11f0 = SVar9;
            local_11f0[1] = SVar8;
            uVar19 = auVar52._0_8_;
            local_11f0 = local_11f0 + 2;
          }
          else {
            lVar11 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            auVar73._8_8_ = 0;
            auVar73._0_8_ = *(ulong *)(uVar14 + lVar11 * 8);
            auVar63 = vpunpcklqdq_avx(auVar73,ZEXT416((uint)tNear.field_0.i[lVar11]));
            auVar58 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar52,auVar44,auVar58);
            auVar44 = vblendvps_avx(auVar44,auVar52,auVar58);
            auVar52 = vpcmpgtd_avx(auVar63,auVar57);
            auVar58 = vpshufd_avx(auVar52,0xaa);
            auVar52 = vblendvps_avx(auVar63,auVar57,auVar58);
            auVar57 = vblendvps_avx(auVar57,auVar63,auVar58);
            auVar58 = vpcmpgtd_avx(auVar57,auVar44);
            auVar63 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar57,auVar44,auVar63);
            SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar44,auVar57,auVar63);
            auVar44 = vpcmpgtd_avx(auVar52,auVar43);
            auVar57 = vpshufd_avx(auVar44,0xaa);
            auVar44 = vblendvps_avx(auVar52,auVar43,auVar57);
            auVar52 = vblendvps_avx(auVar43,auVar52,auVar57);
            auVar43 = vpcmpgtd_avx(auVar58,auVar52);
            auVar43 = vpshufd_avx(auVar43,0xaa);
            SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar58,auVar52,auVar43);
            SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar52,auVar58,auVar43);
            *local_11f0 = SVar8;
            local_11f0[1] = SVar10;
            local_11f0[2] = SVar9;
            uVar19 = auVar44._0_8_;
            local_11f0 = local_11f0 + 3;
          }
        }
      }
    }
    local_11e8 = (ulong)((uint)uVar19 & 0xf) - 8;
    uVar19 = uVar19 & 0xfffffffffffffff0;
    for (local_11e0 = 0; local_11e0 != local_11e8; local_11e0 = local_11e0 + 1) {
      lVar31 = local_11e0 * 0x50;
      pSVar6 = context->scene;
      pGVar7 = (pSVar6->geometries).items[*(uint *)(uVar19 + 0x30 + lVar31)].ptr;
      fVar115 = (pGVar7->time_range).lower;
      fVar115 = pGVar7->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar115) / ((pGVar7->time_range).upper - fVar115)
                );
      auVar44 = vroundss_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),9);
      auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
      auVar66 = vmaxss_avx(ZEXT816(0),auVar44);
      lVar18 = (long)(int)auVar66._0_4_ * 0x38;
      uVar26 = (ulong)*(uint *)(uVar19 + 4 + lVar31);
      lVar11 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar18);
      lVar18 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar18);
      auVar44 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar19 + lVar31) * 4);
      uVar17 = (ulong)*(uint *)(uVar19 + 0x10 + lVar31);
      auVar52 = *(undefined1 (*) [16])(lVar11 + uVar17 * 4);
      uVar20 = (ulong)*(uint *)(uVar19 + 0x20 + lVar31);
      auVar35 = *(undefined1 (*) [16])(lVar11 + uVar20 * 4);
      auVar43 = *(undefined1 (*) [16])(lVar11 + uVar26 * 4);
      uVar22 = (ulong)*(uint *)(uVar19 + 0x14 + lVar31);
      auVar57 = *(undefined1 (*) [16])(lVar11 + uVar22 * 4);
      uVar23 = (ulong)*(uint *)(uVar19 + 0x24 + lVar31);
      auVar36 = *(undefined1 (*) [16])(lVar11 + uVar23 * 4);
      uVar24 = (ulong)*(uint *)(uVar19 + 8 + lVar31);
      auVar58 = *(undefined1 (*) [16])(lVar11 + uVar24 * 4);
      uVar30 = (ulong)*(uint *)(uVar19 + 0x18 + lVar31);
      auVar63 = *(undefined1 (*) [16])(lVar11 + uVar30 * 4);
      uVar27 = (ulong)*(uint *)(uVar19 + 0x28 + lVar31);
      auVar64 = *(undefined1 (*) [16])(lVar11 + uVar27 * 4);
      uVar25 = (ulong)*(uint *)(uVar19 + 0xc + lVar31);
      auVar72 = *(undefined1 (*) [16])(lVar11 + uVar25 * 4);
      uVar28 = (ulong)*(uint *)(uVar19 + 0x1c + lVar31);
      auVar53 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
      uVar14 = (ulong)*(uint *)(uVar19 + 0x2c + lVar31);
      auVar59 = *(undefined1 (*) [16])(lVar11 + uVar14 * 4);
      auVar73 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar19 + lVar31) * 4);
      auVar79 = *(undefined1 (*) [16])(lVar18 + uVar17 * 4);
      fVar115 = fVar115 - auVar66._0_4_;
      auVar66 = vunpcklps_avx(auVar44,auVar58);
      auVar58 = vunpckhps_avx(auVar44,auVar58);
      auVar45 = vunpcklps_avx(auVar43,auVar72);
      auVar43 = vunpckhps_avx(auVar43,auVar72);
      auVar44 = *(undefined1 (*) [16])(lVar18 + uVar26 * 4);
      auVar33 = vunpcklps_avx(auVar58,auVar43);
      auVar34 = vunpcklps_avx(auVar66,auVar45);
      auVar58 = vunpckhps_avx(auVar66,auVar45);
      auVar72 = vunpcklps_avx(auVar52,auVar63);
      auVar43 = vunpckhps_avx(auVar52,auVar63);
      auVar63 = vunpcklps_avx(auVar57,auVar53);
      auVar57 = vunpckhps_avx(auVar57,auVar53);
      auVar52 = *(undefined1 (*) [16])(lVar18 + uVar24 * 4);
      auVar53 = vunpcklps_avx(auVar43,auVar57);
      auVar66 = vunpcklps_avx(auVar72,auVar63);
      auVar57 = vunpckhps_avx(auVar72,auVar63);
      auVar72 = vunpcklps_avx(auVar35,auVar64);
      auVar63 = vunpckhps_avx(auVar35,auVar64);
      auVar45 = vunpcklps_avx(auVar36,auVar59);
      auVar64 = vunpckhps_avx(auVar36,auVar59);
      auVar43 = *(undefined1 (*) [16])(lVar18 + uVar25 * 4);
      auVar59 = vunpcklps_avx(auVar63,auVar64);
      auVar35 = vunpcklps_avx(auVar72,auVar45);
      auVar63 = vunpckhps_avx(auVar72,auVar45);
      auVar64 = vunpcklps_avx(auVar73,auVar52);
      auVar52 = vunpckhps_avx(auVar73,auVar52);
      auVar72 = vunpcklps_avx(auVar44,auVar43);
      auVar43 = vunpckhps_avx(auVar44,auVar43);
      auVar44 = *(undefined1 (*) [16])(lVar18 + uVar30 * 4);
      auVar73 = vunpcklps_avx(auVar52,auVar43);
      auVar45 = vunpcklps_avx(auVar64,auVar72);
      auVar43 = vunpckhps_avx(auVar64,auVar72);
      auVar72 = vunpcklps_avx(auVar79,auVar44);
      auVar64 = vunpckhps_avx(auVar79,auVar44);
      auVar44 = *(undefined1 (*) [16])(lVar18 + uVar22 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
      auVar79 = vunpcklps_avx(auVar44,auVar52);
      auVar44 = vunpckhps_avx(auVar44,auVar52);
      auVar36 = vunpcklps_avx(auVar64,auVar44);
      auVar46 = vunpcklps_avx(auVar72,auVar79);
      auVar64 = vunpckhps_avx(auVar72,auVar79);
      auVar44 = *(undefined1 (*) [16])(lVar18 + uVar20 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
      auVar79 = vunpcklps_avx(auVar44,auVar52);
      auVar72 = vunpckhps_avx(auVar44,auVar52);
      auVar44 = *(undefined1 (*) [16])(lVar18 + uVar23 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar18 + uVar14 * 4);
      auVar47 = vunpcklps_avx(auVar44,auVar52);
      auVar44 = vunpckhps_avx(auVar44,auVar52);
      auVar52 = vunpcklps_avx(auVar72,auVar44);
      auVar72 = vunpcklps_avx(auVar79,auVar47);
      auVar44 = vunpckhps_avx(auVar79,auVar47);
      fVar119 = 1.0 - fVar115;
      auVar113._4_4_ = fVar119;
      auVar113._0_4_ = fVar119;
      auVar113._8_4_ = fVar119;
      auVar113._12_4_ = fVar119;
      auVar79._0_4_ = fVar115 * auVar45._0_4_;
      auVar79._4_4_ = fVar115 * auVar45._4_4_;
      auVar79._8_4_ = fVar115 * auVar45._8_4_;
      auVar79._12_4_ = fVar115 * auVar45._12_4_;
      auVar79 = vfmadd231ps_fma(auVar79,auVar113,auVar34);
      auVar95._0_4_ = fVar115 * auVar43._0_4_;
      auVar95._4_4_ = fVar115 * auVar43._4_4_;
      auVar95._8_4_ = fVar115 * auVar43._8_4_;
      auVar95._12_4_ = fVar115 * auVar43._12_4_;
      auVar58 = vfmadd231ps_fma(auVar95,auVar113,auVar58);
      auVar87._0_4_ = fVar115 * auVar73._0_4_;
      auVar87._4_4_ = fVar115 * auVar73._4_4_;
      auVar87._8_4_ = fVar115 * auVar73._8_4_;
      auVar87._12_4_ = fVar115 * auVar73._12_4_;
      auVar73 = vfmadd231ps_fma(auVar87,auVar113,auVar33);
      auVar74._0_4_ = fVar115 * auVar46._0_4_;
      auVar74._4_4_ = fVar115 * auVar46._4_4_;
      auVar74._8_4_ = fVar115 * auVar46._8_4_;
      auVar74._12_4_ = fVar115 * auVar46._12_4_;
      auVar66 = vfmadd231ps_fma(auVar74,auVar113,auVar66);
      auVar65._0_4_ = fVar115 * auVar64._0_4_;
      auVar65._4_4_ = fVar115 * auVar64._4_4_;
      auVar65._8_4_ = fVar115 * auVar64._8_4_;
      auVar65._12_4_ = fVar115 * auVar64._12_4_;
      auVar64 = vfmadd231ps_fma(auVar65,auVar113,auVar57);
      puVar1 = (undefined8 *)(uVar19 + 0x30 + lVar31);
      local_1018 = *puVar1;
      uStack_1010 = puVar1[1];
      puVar1 = (undefined8 *)(uVar19 + 0x40 + lVar31);
      auVar45._0_4_ = fVar115 * auVar36._0_4_;
      auVar45._4_4_ = fVar115 * auVar36._4_4_;
      auVar45._8_4_ = fVar115 * auVar36._8_4_;
      auVar45._12_4_ = fVar115 * auVar36._12_4_;
      auVar53 = vfmadd231ps_fma(auVar45,auVar113,auVar53);
      auVar54._0_4_ = fVar115 * auVar72._0_4_;
      auVar54._4_4_ = fVar115 * auVar72._4_4_;
      auVar54._8_4_ = fVar115 * auVar72._8_4_;
      auVar54._12_4_ = fVar115 * auVar72._12_4_;
      auVar60._0_4_ = fVar115 * auVar44._0_4_;
      auVar60._4_4_ = fVar115 * auVar44._4_4_;
      auVar60._8_4_ = fVar115 * auVar44._8_4_;
      auVar60._12_4_ = fVar115 * auVar44._12_4_;
      auVar103._0_4_ = fVar115 * auVar52._0_4_;
      auVar103._4_4_ = fVar115 * auVar52._4_4_;
      auVar103._8_4_ = fVar115 * auVar52._8_4_;
      auVar103._12_4_ = fVar115 * auVar52._12_4_;
      auVar72 = vfmadd231ps_fma(auVar54,auVar113,auVar35);
      auVar45 = vfmadd231ps_fma(auVar60,auVar113,auVar63);
      auVar59 = vfmadd231ps_fma(auVar103,auVar113,auVar59);
      local_1198 = *puVar1;
      uStack_1190 = puVar1[1];
      uVar13 = *(undefined4 *)(ray + k * 4);
      auVar33._4_4_ = uVar13;
      auVar33._0_4_ = uVar13;
      auVar33._8_4_ = uVar13;
      auVar33._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar116._4_4_ = uVar13;
      auVar116._0_4_ = uVar13;
      auVar116._8_4_ = uVar13;
      auVar116._12_4_ = uVar13;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar120._4_4_ = uVar13;
      auVar120._0_4_ = uVar13;
      auVar120._8_4_ = uVar13;
      auVar120._12_4_ = uVar13;
      auVar43 = vsubps_avx(auVar79,auVar33);
      auVar57 = vsubps_avx(auVar58,auVar116);
      auVar44 = vsubps_avx(auVar73,auVar120);
      auVar52 = vsubps_avx(auVar66,auVar33);
      auVar58 = vsubps_avx(auVar64,auVar116);
      auVar63 = vsubps_avx(auVar53,auVar120);
      auVar64 = vsubps_avx(auVar72,auVar33);
      auVar72 = vsubps_avx(auVar45,auVar116);
      auVar53 = vsubps_avx(auVar59,auVar120);
      auVar59 = vsubps_avx(auVar64,auVar43);
      auVar73 = vsubps_avx(auVar72,auVar57);
      auVar79 = vsubps_avx(auVar53,auVar44);
      auVar34._0_4_ = auVar64._0_4_ + auVar43._0_4_;
      auVar34._4_4_ = auVar64._4_4_ + auVar43._4_4_;
      auVar34._8_4_ = auVar64._8_4_ + auVar43._8_4_;
      auVar34._12_4_ = auVar64._12_4_ + auVar43._12_4_;
      auVar61._0_4_ = auVar72._0_4_ + auVar57._0_4_;
      auVar61._4_4_ = auVar72._4_4_ + auVar57._4_4_;
      auVar61._8_4_ = auVar72._8_4_ + auVar57._8_4_;
      auVar61._12_4_ = auVar72._12_4_ + auVar57._12_4_;
      fVar119 = auVar44._0_4_;
      auVar66._0_4_ = auVar53._0_4_ + fVar119;
      fVar125 = auVar44._4_4_;
      auVar66._4_4_ = auVar53._4_4_ + fVar125;
      fVar102 = auVar44._8_4_;
      auVar66._8_4_ = auVar53._8_4_ + fVar102;
      fVar107 = auVar44._12_4_;
      auVar66._12_4_ = auVar53._12_4_ + fVar107;
      auVar117._0_4_ = auVar79._0_4_ * auVar61._0_4_;
      auVar117._4_4_ = auVar79._4_4_ * auVar61._4_4_;
      auVar117._8_4_ = auVar79._8_4_ * auVar61._8_4_;
      auVar117._12_4_ = auVar79._12_4_ * auVar61._12_4_;
      auVar45 = vfmsub231ps_fma(auVar117,auVar73,auVar66);
      auVar67._0_4_ = auVar59._0_4_ * auVar66._0_4_;
      auVar67._4_4_ = auVar59._4_4_ * auVar66._4_4_;
      auVar67._8_4_ = auVar59._8_4_ * auVar66._8_4_;
      auVar67._12_4_ = auVar59._12_4_ * auVar66._12_4_;
      auVar66 = vfmsub231ps_fma(auVar67,auVar79,auVar34);
      auVar35._0_4_ = auVar73._0_4_ * auVar34._0_4_;
      auVar35._4_4_ = auVar73._4_4_ * auVar34._4_4_;
      auVar35._8_4_ = auVar73._8_4_ * auVar34._8_4_;
      auVar35._12_4_ = auVar73._12_4_ * auVar34._12_4_;
      auVar33 = vfmsub231ps_fma(auVar35,auVar59,auVar61);
      fVar115 = *(float *)(ray + k * 4 + 0x60);
      auVar55._0_4_ = fVar115 * auVar33._0_4_;
      auVar55._4_4_ = fVar115 * auVar33._4_4_;
      auVar55._8_4_ = fVar115 * auVar33._8_4_;
      auVar55._12_4_ = fVar115 * auVar33._12_4_;
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar96._4_4_ = uVar13;
      auVar96._0_4_ = uVar13;
      auVar96._8_4_ = uVar13;
      auVar96._12_4_ = uVar13;
      auVar66 = vfmadd231ps_fma(auVar55,auVar96,auVar66);
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar121._4_4_ = uVar13;
      auVar121._0_4_ = uVar13;
      auVar121._8_4_ = uVar13;
      auVar121._12_4_ = uVar13;
      local_1038 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vfmadd231ps_fma(auVar66,auVar121,auVar45);
      auVar66 = vsubps_avx(auVar57,auVar58);
      local_1028 = vsubps_avx(auVar44,auVar63);
      auVar62._0_4_ = auVar57._0_4_ + auVar58._0_4_;
      auVar62._4_4_ = auVar57._4_4_ + auVar58._4_4_;
      auVar62._8_4_ = auVar57._8_4_ + auVar58._8_4_;
      auVar62._12_4_ = auVar57._12_4_ + auVar58._12_4_;
      auVar68._0_4_ = auVar63._0_4_ + fVar119;
      auVar68._4_4_ = auVar63._4_4_ + fVar125;
      auVar68._8_4_ = auVar63._8_4_ + fVar102;
      auVar68._12_4_ = auVar63._12_4_ + fVar107;
      fVar112 = local_1028._0_4_;
      auVar80._0_4_ = auVar62._0_4_ * fVar112;
      fVar105 = local_1028._4_4_;
      auVar80._4_4_ = auVar62._4_4_ * fVar105;
      fVar109 = local_1028._8_4_;
      auVar80._8_4_ = auVar62._8_4_ * fVar109;
      fVar111 = local_1028._12_4_;
      auVar80._12_4_ = auVar62._12_4_ * fVar111;
      auVar33 = vfmsub231ps_fma(auVar80,auVar66,auVar68);
      auVar45 = vsubps_avx(auVar43,auVar52);
      fVar126 = auVar45._0_4_;
      auVar88._0_4_ = fVar126 * auVar68._0_4_;
      fVar129 = auVar45._4_4_;
      auVar88._4_4_ = fVar129 * auVar68._4_4_;
      fVar131 = auVar45._8_4_;
      auVar88._8_4_ = fVar131 * auVar68._8_4_;
      fVar133 = auVar45._12_4_;
      auVar88._12_4_ = fVar133 * auVar68._12_4_;
      auVar69._0_4_ = auVar43._0_4_ + auVar52._0_4_;
      auVar69._4_4_ = auVar43._4_4_ + auVar52._4_4_;
      auVar69._8_4_ = auVar43._8_4_ + auVar52._8_4_;
      auVar69._12_4_ = auVar43._12_4_ + auVar52._12_4_;
      auVar44 = vfmsub231ps_fma(auVar88,local_1028,auVar69);
      fVar104 = auVar66._0_4_;
      auVar70._0_4_ = auVar69._0_4_ * fVar104;
      fVar106 = auVar66._4_4_;
      auVar70._4_4_ = auVar69._4_4_ * fVar106;
      fVar110 = auVar66._8_4_;
      auVar70._8_4_ = auVar69._8_4_ * fVar110;
      fVar114 = auVar66._12_4_;
      auVar70._12_4_ = auVar69._12_4_ * fVar114;
      auVar34 = vfmsub231ps_fma(auVar70,auVar45,auVar62);
      auVar71._0_4_ = fVar115 * auVar34._0_4_;
      auVar71._4_4_ = fVar115 * auVar34._4_4_;
      auVar71._8_4_ = fVar115 * auVar34._8_4_;
      auVar71._12_4_ = fVar115 * auVar34._12_4_;
      auVar44 = vfmadd231ps_fma(auVar71,auVar96,auVar44);
      auVar34 = vfmadd231ps_fma(auVar44,auVar121,auVar33);
      auVar33 = vsubps_avx(auVar52,auVar64);
      auVar81._0_4_ = auVar64._0_4_ + auVar52._0_4_;
      auVar81._4_4_ = auVar64._4_4_ + auVar52._4_4_;
      auVar81._8_4_ = auVar64._8_4_ + auVar52._8_4_;
      auVar81._12_4_ = auVar64._12_4_ + auVar52._12_4_;
      auVar64 = vsubps_avx(auVar58,auVar72);
      auVar36._0_4_ = auVar58._0_4_ + auVar72._0_4_;
      auVar36._4_4_ = auVar58._4_4_ + auVar72._4_4_;
      auVar36._8_4_ = auVar58._8_4_ + auVar72._8_4_;
      auVar36._12_4_ = auVar58._12_4_ + auVar72._12_4_;
      auVar58 = vsubps_avx(auVar63,auVar53);
      auVar46._0_4_ = auVar63._0_4_ + auVar53._0_4_;
      auVar46._4_4_ = auVar63._4_4_ + auVar53._4_4_;
      auVar46._8_4_ = auVar63._8_4_ + auVar53._8_4_;
      auVar46._12_4_ = auVar63._12_4_ + auVar53._12_4_;
      auVar89._0_4_ = auVar36._0_4_ * auVar58._0_4_;
      auVar89._4_4_ = auVar36._4_4_ * auVar58._4_4_;
      auVar89._8_4_ = auVar36._8_4_ * auVar58._8_4_;
      auVar89._12_4_ = auVar36._12_4_ * auVar58._12_4_;
      auVar52 = vfmsub231ps_fma(auVar89,auVar64,auVar46);
      auVar47._0_4_ = auVar46._0_4_ * auVar33._0_4_;
      auVar47._4_4_ = auVar46._4_4_ * auVar33._4_4_;
      auVar47._8_4_ = auVar46._8_4_ * auVar33._8_4_;
      auVar47._12_4_ = auVar46._12_4_ * auVar33._12_4_;
      auVar44 = vfmsub231ps_fma(auVar47,auVar58,auVar81);
      auVar82._0_4_ = auVar64._0_4_ * auVar81._0_4_;
      auVar82._4_4_ = auVar64._4_4_ * auVar81._4_4_;
      auVar82._8_4_ = auVar64._8_4_ * auVar81._8_4_;
      auVar82._12_4_ = auVar64._12_4_ * auVar81._12_4_;
      auVar63 = vfmsub231ps_fma(auVar82,auVar33,auVar36);
      auVar83._0_4_ = fVar115 * auVar63._0_4_;
      auVar83._4_4_ = fVar115 * auVar63._4_4_;
      auVar83._8_4_ = fVar115 * auVar63._8_4_;
      auVar83._12_4_ = fVar115 * auVar63._12_4_;
      auVar44 = vfmadd231ps_fma(auVar83,auVar96,auVar44);
      auVar63 = vfmadd231ps_fma(auVar44,auVar121,auVar52);
      auVar108._0_4_ = auVar63._0_4_ + local_1038.v[0] + auVar34._0_4_;
      auVar108._4_4_ = auVar63._4_4_ + local_1038.v[1] + auVar34._4_4_;
      auVar108._8_4_ = auVar63._8_4_ + local_1038.v[2] + auVar34._8_4_;
      auVar108._12_4_ = auVar63._12_4_ + local_1038.v[3] + auVar34._12_4_;
      auVar127._8_4_ = 0x7fffffff;
      auVar127._0_8_ = 0x7fffffff7fffffff;
      auVar127._12_4_ = 0x7fffffff;
      auVar44 = vminps_avx((undefined1  [16])local_1038,auVar34);
      auVar44 = vminps_avx(auVar44,auVar63);
      local_1048 = vandps_avx(auVar108,auVar127);
      auVar97._0_4_ = local_1048._0_4_ * 1.1920929e-07;
      auVar97._4_4_ = local_1048._4_4_ * 1.1920929e-07;
      auVar97._8_4_ = local_1048._8_4_ * 1.1920929e-07;
      auVar97._12_4_ = local_1048._12_4_ * 1.1920929e-07;
      uVar30 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
      auVar90._0_8_ = uVar30 ^ 0x8000000080000000;
      auVar90._8_4_ = -auVar97._8_4_;
      auVar90._12_4_ = -auVar97._12_4_;
      auVar44 = vcmpps_avx(auVar44,auVar90,5);
      auVar52 = vmaxps_avx((undefined1  [16])local_1038,auVar34);
      auVar52 = vmaxps_avx(auVar52,auVar63);
      auVar52 = vcmpps_avx(auVar52,auVar97,2);
      auVar44 = vorps_avx(auVar44,auVar52);
      if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar44[0xf] < '\0'
         ) {
        auVar48._0_4_ = fVar104 * auVar79._0_4_;
        auVar48._4_4_ = fVar106 * auVar79._4_4_;
        auVar48._8_4_ = fVar110 * auVar79._8_4_;
        auVar48._12_4_ = fVar114 * auVar79._12_4_;
        auVar84._0_4_ = fVar126 * auVar73._0_4_;
        auVar84._4_4_ = fVar129 * auVar73._4_4_;
        auVar84._8_4_ = fVar131 * auVar73._8_4_;
        auVar84._12_4_ = fVar133 * auVar73._12_4_;
        auVar63 = vfmsub213ps_fma(auVar73,local_1028,auVar48);
        auVar91._0_4_ = auVar64._0_4_ * fVar112;
        auVar91._4_4_ = auVar64._4_4_ * fVar105;
        auVar91._8_4_ = auVar64._8_4_ * fVar109;
        auVar91._12_4_ = auVar64._12_4_ * fVar111;
        auVar98._0_4_ = fVar126 * auVar58._0_4_;
        auVar98._4_4_ = fVar129 * auVar58._4_4_;
        auVar98._8_4_ = fVar131 * auVar58._8_4_;
        auVar98._12_4_ = fVar133 * auVar58._12_4_;
        auVar72 = vfmsub213ps_fma(auVar58,auVar66,auVar91);
        auVar52 = vandps_avx(auVar127,auVar48);
        auVar58 = vandps_avx(auVar127,auVar91);
        auVar52 = vcmpps_avx(auVar52,auVar58,1);
        local_1108 = vblendvps_avx(auVar72,auVar63,auVar52);
        auVar75._0_4_ = fVar104 * auVar33._0_4_;
        auVar75._4_4_ = fVar106 * auVar33._4_4_;
        auVar75._8_4_ = fVar110 * auVar33._8_4_;
        auVar75._12_4_ = fVar114 * auVar33._12_4_;
        auVar63 = vfmsub213ps_fma(auVar33,local_1028,auVar98);
        auVar92._0_4_ = auVar59._0_4_ * fVar112;
        auVar92._4_4_ = auVar59._4_4_ * fVar105;
        auVar92._8_4_ = auVar59._8_4_ * fVar109;
        auVar92._12_4_ = auVar59._12_4_ * fVar111;
        auVar72 = vfmsub213ps_fma(auVar79,auVar45,auVar92);
        auVar52 = vandps_avx(auVar127,auVar92);
        auVar58 = vandps_avx(auVar98,auVar127);
        auVar52 = vcmpps_avx(auVar52,auVar58,1);
        local_10f8 = vblendvps_avx(auVar63,auVar72,auVar52);
        auVar63 = vfmsub213ps_fma(auVar59,auVar66,auVar84);
        auVar64 = vfmsub213ps_fma(auVar64,auVar45,auVar75);
        auVar52 = vandps_avx(auVar127,auVar84);
        auVar58 = vandps_avx(auVar127,auVar75);
        auVar52 = vcmpps_avx(auVar52,auVar58,1);
        local_10e8 = vblendvps_avx(auVar64,auVar63,auVar52);
        auVar76._0_4_ = local_10e8._0_4_ * fVar115;
        auVar76._4_4_ = local_10e8._4_4_ * fVar115;
        auVar76._8_4_ = local_10e8._8_4_ * fVar115;
        auVar76._12_4_ = local_10e8._12_4_ * fVar115;
        auVar52 = vfmadd213ps_fma(auVar96,local_10f8,auVar76);
        auVar52 = vfmadd213ps_fma(auVar121,local_1108,auVar52);
        auVar77._0_4_ = auVar52._0_4_ + auVar52._0_4_;
        auVar77._4_4_ = auVar52._4_4_ + auVar52._4_4_;
        auVar77._8_4_ = auVar52._8_4_ + auVar52._8_4_;
        auVar77._12_4_ = auVar52._12_4_ + auVar52._12_4_;
        auVar85._0_4_ = local_10e8._0_4_ * fVar119;
        auVar85._4_4_ = local_10e8._4_4_ * fVar125;
        auVar85._8_4_ = local_10e8._8_4_ * fVar102;
        auVar85._12_4_ = local_10e8._12_4_ * fVar107;
        auVar52 = vfmadd213ps_fma(auVar57,local_10f8,auVar85);
        auVar43 = vfmadd213ps_fma(auVar43,local_1108,auVar52);
        auVar52 = vrcpps_avx(auVar77);
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auVar57 = vfnmadd213ps_fma(auVar52,auVar77,auVar99);
        auVar52 = vfmadd132ps_fma(auVar57,auVar52,auVar52);
        local_1118._0_4_ = auVar52._0_4_ * (auVar43._0_4_ + auVar43._0_4_);
        local_1118._4_4_ = auVar52._4_4_ * (auVar43._4_4_ + auVar43._4_4_);
        local_1118._8_4_ = auVar52._8_4_ * (auVar43._8_4_ + auVar43._8_4_);
        local_1118._12_4_ = auVar52._12_4_ * (auVar43._12_4_ + auVar43._12_4_);
        auVar42 = ZEXT1664(local_1118);
        uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar86._4_4_ = uVar13;
        auVar86._0_4_ = uVar13;
        auVar86._8_4_ = uVar13;
        auVar86._12_4_ = uVar13;
        auVar52 = vcmpps_avx(auVar86,local_1118,2);
        uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar100._4_4_ = uVar13;
        auVar100._0_4_ = uVar13;
        auVar100._8_4_ = uVar13;
        auVar100._12_4_ = uVar13;
        auVar93 = ZEXT1664(auVar100);
        auVar43 = vcmpps_avx(local_1118,auVar100,2);
        auVar52 = vandps_avx(auVar52,auVar43);
        auVar57 = auVar44 & auVar52;
        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          auVar44 = vandps_avx(auVar52,auVar44);
          auVar52 = vcmpps_avx(auVar77,_DAT_01f45a50,4);
          auVar57 = auVar52 & auVar44;
          if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar57[0xf] < '\0') {
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar44,auVar52);
            tNear.field_0 = local_1038;
            pUVar15 = &mapUV;
            auVar44 = vrcpps_avx(auVar108);
            auVar56._8_4_ = 0x3f800000;
            auVar56._0_8_ = 0x3f8000003f800000;
            auVar56._12_4_ = 0x3f800000;
            auVar52 = vfnmadd213ps_fma(auVar108,auVar44,auVar56);
            auVar52 = vfmadd132ps_fma(auVar52,auVar44,auVar44);
            auVar49._8_4_ = 0x219392ef;
            auVar49._0_8_ = 0x219392ef219392ef;
            auVar49._12_4_ = 0x219392ef;
            auVar44 = vcmpps_avx(local_1048,auVar49,5);
            auVar44 = vandps_avx(auVar52,auVar44);
            auVar37._0_4_ = local_1038.v[0] * auVar44._0_4_;
            auVar37._4_4_ = local_1038.v[1] * auVar44._4_4_;
            auVar37._8_4_ = local_1038.v[2] * auVar44._8_4_;
            auVar37._12_4_ = local_1038.v[3] * auVar44._12_4_;
            local_1138 = vminps_avx(auVar37,auVar56);
            auVar38._0_4_ = auVar44._0_4_ * auVar34._0_4_;
            auVar38._4_4_ = auVar44._4_4_ * auVar34._4_4_;
            auVar38._8_4_ = auVar44._8_4_ * auVar34._8_4_;
            auVar38._12_4_ = auVar44._12_4_ * auVar34._12_4_;
            local_1128 = vminps_avx(auVar38,auVar56);
            auVar50._8_4_ = 0x7f800000;
            auVar50._0_8_ = 0x7f8000007f800000;
            auVar50._12_4_ = 0x7f800000;
            auVar44 = vblendvps_avx(auVar50,local_1118,(undefined1  [16])valid.field_0);
            auVar52 = vshufps_avx(auVar44,auVar44,0xb1);
            auVar52 = vminps_avx(auVar52,auVar44);
            auVar57 = vshufpd_avx(auVar52,auVar52,1);
            auVar52 = vminps_avx(auVar57,auVar52);
            auVar44 = vcmpps_avx(auVar44,auVar52,0);
            auVar57 = (undefined1  [16])valid.field_0 & auVar44;
            auVar52 = vpcmpeqd_avx(auVar52,auVar52);
            if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar57[0xf] < '\0') {
              auVar52 = auVar44;
            }
            auVar44 = vandps_avx((undefined1  [16])valid.field_0,auVar52);
            auVar52 = vpcmpeqd_avx(auVar43,auVar43);
            auVar94 = ZEXT1664(auVar52);
            do {
              auVar44 = vpslld_avx(auVar44,0x1f);
              uVar13 = vmovmskps_avx(auVar44);
              lVar11 = 0;
              for (uVar30 = CONCAT44((int)((ulong)pUVar15 >> 0x20),uVar13); (uVar30 & 1) == 0;
                  uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              uVar16 = *(uint *)((long)&local_1018 + lVar11 * 4);
              pUVar15 = (UVIdentity<4> *)(ulong)uVar16;
              pGVar7 = (pSVar6->geometries).items[(long)pUVar15].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar11] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar30 = (ulong)(uint)((int)lVar11 << 2);
                  uVar13 = *(undefined4 *)(local_1138 + uVar30);
                  uVar3 = *(undefined4 *)(local_1128 + uVar30);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + uVar30);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1108 + uVar30);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10f8 + uVar30);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10e8 + uVar30);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar13;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_1198 + uVar30)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar16;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar30 = (ulong)(uint)((int)lVar11 * 4);
                uVar13 = *(undefined4 *)(local_1138 + uVar30);
                local_fd8._4_4_ = uVar13;
                local_fd8._0_4_ = uVar13;
                local_fd8._8_4_ = uVar13;
                local_fd8._12_4_ = uVar13;
                local_fc8 = *(undefined4 *)(local_1128 + uVar30);
                local_fa8._4_4_ = uVar16;
                local_fa8._0_4_ = uVar16;
                local_fa8._8_4_ = uVar16;
                local_fa8._12_4_ = uVar16;
                uVar13 = *(undefined4 *)((long)&local_1198 + uVar30);
                local_fb8._4_4_ = uVar13;
                local_fb8._0_4_ = uVar13;
                local_fb8._8_4_ = uVar13;
                local_fb8._12_4_ = uVar13;
                uVar13 = *(undefined4 *)(local_1108 + uVar30);
                uVar3 = *(undefined4 *)(local_10f8 + uVar30);
                local_ff8._4_4_ = uVar3;
                local_ff8._0_4_ = uVar3;
                local_ff8._8_4_ = uVar3;
                local_ff8._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_10e8 + uVar30);
                local_fe8._4_4_ = uVar3;
                local_fe8._0_4_ = uVar3;
                local_fe8._8_4_ = uVar3;
                local_fe8._12_4_ = uVar3;
                local_1008[0] = (RTCHitN)(char)uVar13;
                local_1008[1] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar13;
                local_1008[5] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar13;
                local_1008[9] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar13;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar13 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                uStack_fc4 = local_fc8;
                uStack_fc0 = local_fc8;
                uStack_fbc = local_fc8;
                vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                uStack_f94 = context->user->instID[0];
                local_f98 = uStack_f94;
                uStack_f90 = uStack_f94;
                uStack_f8c = uStack_f94;
                uStack_f88 = context->user->instPrimID[0];
                uStack_f84 = uStack_f88;
                uStack_f80 = uStack_f88;
                uStack_f7c = uStack_f88;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + uVar30);
                local_1218 = *local_1200;
                args.valid = (int *)local_1218;
                args.geometryUserPtr = pGVar7->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                pUVar15 = (UVIdentity<4> *)pGVar7->intersectionFilterN;
                auVar44 = auVar42._0_16_;
                auVar52 = auVar93._0_16_;
                args.ray = (RTCRayN *)ray;
                if (pUVar15 != (UVIdentity<4> *)0x0) {
                  auVar43 = auVar94._0_16_;
                  pUVar15 = (UVIdentity<4> *)(*(code *)pUVar15)(&args);
                  auVar93 = ZEXT1664(auVar52);
                  auVar42 = ZEXT1664(auVar44);
                  auVar43 = vpcmpeqd_avx(auVar43,auVar43);
                  auVar94 = ZEXT1664(auVar43);
                }
                auVar43 = auVar94._0_16_;
                if (local_1218 == (undefined1  [16])0x0) {
                  auVar44 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar44 = auVar44 ^ auVar43;
                }
                else {
                  pUVar15 = (UVIdentity<4> *)context->args->filter;
                  if ((pUVar15 != (UVIdentity<4> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pUVar15 = (UVIdentity<4> *)(*(code *)pUVar15)(&args);
                    auVar93 = ZEXT1664(auVar52);
                    auVar42 = ZEXT1664(auVar44);
                    auVar44 = vpcmpeqd_avx(auVar43,auVar43);
                    auVar94 = ZEXT1664(auVar44);
                  }
                  auVar52 = vpcmpeqd_avx(local_1218,_DAT_01f45a50);
                  auVar44 = auVar52 ^ auVar94._0_16_;
                  if (local_1218 != (undefined1  [16])0x0) {
                    auVar52 = auVar52 ^ auVar94._0_16_;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])args.hit);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x10));
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x20));
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x30));
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x40));
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar43;
                    auVar43 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar43;
                    auVar52 = vmaskmovps_avx(auVar52,*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar52;
                    pUVar15 = (UVIdentity<4> *)args.ray;
                  }
                }
                auVar40._8_8_ = 0x100000001;
                auVar40._0_8_ = 0x100000001;
                if ((auVar40 & auVar44) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar93._0_4_;
                }
                else {
                  auVar93 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[lVar11] = 0.0;
                uVar13 = auVar93._0_4_;
                auVar41._4_4_ = uVar13;
                auVar41._0_4_ = uVar13;
                auVar41._8_4_ = uVar13;
                auVar41._12_4_ = uVar13;
                auVar44 = vcmpps_avx(auVar42._0_16_,auVar41,2);
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vandps_avx(auVar44,(undefined1  [16])valid.field_0);
              }
              if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 &&
                   ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                   (undefined1  [16])0x0) &&
                  ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) break;
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar44 = vblendvps_avx(auVar51,auVar42._0_16_,(undefined1  [16])valid.field_0);
              auVar52 = vshufps_avx(auVar44,auVar44,0xb1);
              auVar52 = vminps_avx(auVar52,auVar44);
              auVar43 = vshufpd_avx(auVar52,auVar52,1);
              auVar52 = vminps_avx(auVar43,auVar52);
              auVar44 = vcmpps_avx(auVar44,auVar52,0);
              auVar52 = (undefined1  [16])valid.field_0 & auVar44;
              aVar39 = valid.field_0;
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar52[0xf] < '\0') {
                aVar39.v = (__m128)vandps_avx(auVar44,valid.field_0);
              }
              auVar44 = vpcmpgtd_avx(ZEXT816(0) << 0x20,(undefined1  [16])aVar39);
            } while( true );
          }
        }
      }
      auVar93 = ZEXT1664(local_1058);
      auVar94 = ZEXT1664(local_1068);
      auVar101 = ZEXT1664(local_1078);
      uVar30 = local_11f8;
      fVar102 = local_1088;
      fVar104 = fStack_1084;
      fVar105 = fStack_1080;
      fVar106 = fStack_107c;
      fVar107 = local_1098;
      fVar109 = fStack_1094;
      fVar110 = fStack_1090;
      fVar111 = fStack_108c;
      fVar112 = local_10a8;
      fVar114 = fStack_10a4;
      fVar126 = fStack_10a0;
      fVar129 = fStack_109c;
      fVar115 = local_10b8;
      fVar131 = fStack_10b4;
      fVar133 = fStack_10b0;
      fVar118 = fStack_10ac;
      fVar119 = local_10c8;
      fVar122 = fStack_10c4;
      fVar123 = fStack_10c0;
      fVar124 = fStack_10bc;
      fVar125 = local_10d8;
      fVar128 = fStack_10d4;
      fVar130 = fStack_10d0;
      fVar132 = fStack_10cc;
    }
    uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar42 = ZEXT1664(CONCAT412(uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }